

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t>::~BitpackingScanState
          (BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_024877a8;
  BufferHandle::~BufferHandle(&this->handle);
  operator_delete(this);
  return;
}

Assistant:

explicit BitpackingScanState(ColumnSegment &segment) : current_segment(segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		auto data_ptr = handle.Ptr();

		// load offset to bitpacking widths pointer
		auto bitpacking_metadata_offset = Load<idx_t>(data_ptr + segment.GetBlockOffset());
		bitpacking_metadata_ptr =
		    data_ptr + segment.GetBlockOffset() + bitpacking_metadata_offset - sizeof(bitpacking_metadata_encoded_t);

		// load the first group
		LoadNextGroup();
	}